

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O0

void __thiscall
prevector_tests::prevector_tester<8U,_int>::update
          (prevector_tester<8U,_int> *this,Size pos,int *value)

{
  long lVar1;
  size_type *psVar2;
  size_type *in_RDX;
  prevector<8U,_int,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  prevector_tester<8U,_int> *in_stack_00000118;
  size_type sVar3;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = *in_RDX;
  psVar2 = (size_type *)
           std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)in_RDI,
                      CONCAT44(in_stack_ffffffffffffffd4,sVar3));
  *psVar2 = sVar3;
  sVar3 = *in_RDX;
  psVar2 = (size_type *)prevector<8U,_int,_unsigned_int,_int>::operator[](in_RDI,sVar3);
  *psVar2 = sVar3;
  test(in_stack_00000118);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void update(Size pos, const T& value) {
        real_vector[pos] = value;
        pre_vector[pos] = value;
        test();
    }